

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

Index __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_argmax_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *this_00;
  CoeffReturnType plVar1;
  CoeffReturnType pfVar2;
  Index IVar3;
  Index idx;
  Index i;
  Index IStack_28;
  Scalar m;
  Index m_idx;
  IndicesType *idxs;
  RowVectorType *v_local;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  this_00 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)
            PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
  IStack_28 = this->_Np;
  plVar1 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()(this_00,IStack_28);
  pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,*plVar1);
  i._4_4_ = *pfVar2;
  idx = this->_Np;
  while( true ) {
    idx = idx + 1;
    IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    if (IVar3 <= idx) break;
    plVar1 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()(this_00,idx);
    IVar3 = *plVar1;
    pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,IVar3);
    if (i._4_4_ < *pfVar2) {
      pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,IVar3);
      i._4_4_ = *pfVar2;
      IStack_28 = idx;
    }
  }
  return IStack_28;
}

Assistant:

Index _argmax_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Index m_idx = _Np; Scalar m = v(idxs(m_idx));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx); m_idx = i; }
    }
    return m_idx;
  }